

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QUnifiedTimer::uninstallAnimationDriver(QUnifiedTimer *this,QAnimationDriver *d)

{
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QAnimationDriver **)(this + 0x10) == d) {
    if (*(char *)&((*(QAnimationDriver **)(this + 0x10))->super_QObject).d_ptr.d[1].metaObject ==
        '\x01') {
      stopAnimationDriver(this);
      *(QUnifiedTimer **)(this + 0x10) = this + 0x18;
      this[0x66] = (QUnifiedTimer)0x0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        startAnimationDriver(this);
        return;
      }
      goto LAB_0035f976;
    }
    *(QUnifiedTimer **)(this + 0x10) = this + 0x18;
    this[0x66] = (QUnifiedTimer)0x0;
  }
  else {
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    QMessageLogger::warning
              (&local_30,"QUnifiedTimer: trying to uninstall a driver that is not installed...");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_0035f976:
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::uninstallAnimationDriver(QAnimationDriver *d)
{
    if (driver != d) {
        qWarning("QUnifiedTimer: trying to uninstall a driver that is not installed...");
        return;
    }

    bool running = driver->isRunning();
    if (running)
        stopAnimationDriver();
    driver = &defaultDriver;
    allowNegativeDelta = false;
    if (running)
        startAnimationDriver();
}